

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArrayPrimitiveType.h
# Opt level: O0

void __thiscall
COLLADAFW::
ArrayPrimitiveType<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
::allocMemory(ArrayPrimitiveType<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
              *this,size_t capacity,int flags)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **data;
  uint in_EDX;
  size_t in_RSI;
  ArrayPrimitiveType<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  *in_RDI;
  
  if (in_RSI == 0) {
    setData(in_RDI,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    **)0x0,0,0);
  }
  else {
    data = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            **)malloc(in_RSI << 3);
    setData(in_RDI,data,0,in_RSI);
  }
  in_RDI->mFlags = in_EDX | in_RDI->mFlags;
  return;
}

Assistant:

void allocMemory ( size_t capacity, int flags = DEFAULT_ALLOC_FLAGS )
		{
			if ( capacity == 0 )
				setData ( 0, 0, 0 );
			else
				setData ( ( Type* ) ( malloc ( capacity * sizeof (Type) ) ), 0, capacity );
			mFlags |= flags;
		}